

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O3

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
BlindMerge(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           *this,array<std::vector<int,_std::allocator<int>_>_*,_2UL> *arrs,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,iterator cur_run)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  vector<int,_std::allocator<int>_> *pvVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  vector<int,_std::allocator<int>_> *pvVar8;
  pointer piVar9;
  pointer piVar10;
  int iVar11;
  long lVar12;
  _List_node_base *p_Var13;
  long lVar14;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  
  p_Var3 = (cur_run._M_node)->_M_next;
  p_Var4 = p_Var3[1]._M_prev;
  pvVar5 = arrs->_M_elems[(long)p_Var3[1]._M_next];
  p_Var6 = cur_run._M_node[2]._M_next;
  p_Var3 = p_Var3[2]._M_next;
  p_Var13 = p_Var4;
  if (p_Var6 == (_List_node_base *)0x0) {
LAB_001064b2:
    if ((_List_node_base *)((long)p_Var13 - (long)p_Var4) < p_Var3) {
      piVar9 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0;
      do {
        begin._M_current[lVar14] = piVar9[(long)&p_Var13->_M_next + lVar14];
        lVar12 = lVar14 + 1;
        lVar14 = lVar14 + 1;
      } while ((_List_node_base *)
               ((long)&((_List_node_base *)((long)p_Var13 - (long)p_Var4))->_M_next + lVar12) <
               p_Var3);
    }
  }
  else {
    p_Var7 = cur_run._M_node[1]._M_prev;
    pvVar8 = arrs->_M_elems[(long)cur_run._M_node[1]._M_next];
    if (p_Var3 == (_List_node_base *)0x0) {
      p_Var16 = (_List_node_base *)0x0;
    }
    else {
      piVar9 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      p_Var15 = p_Var7;
      do {
        iVar1 = piVar9[(long)p_Var15];
        iVar2 = piVar10[(long)p_Var13];
        iVar11 = iVar2;
        if (iVar1 < iVar2) {
          iVar11 = iVar1;
        }
        p_Var13 = (_List_node_base *)((long)&p_Var13->_M_next + (ulong)(iVar2 <= iVar1));
        p_Var15 = (_List_node_base *)((long)&p_Var15->_M_next + (ulong)(iVar1 < iVar2));
        *begin._M_current = iVar11;
        begin._M_current = begin._M_current + 1;
        p_Var16 = (_List_node_base *)((long)p_Var15 - (long)p_Var7);
        if (p_Var6 <= p_Var16) goto LAB_001064b2;
      } while ((_List_node_base *)((long)p_Var13 - (long)p_Var4) < p_Var3);
    }
    piVar9 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    lVar14 = 0;
    do {
      begin._M_current[lVar14] = piVar9[(long)&p_Var16->_M_next + (long)&p_Var7->_M_next + lVar14];
      lVar14 = lVar14 + 1;
    } while ((long)p_Var6 - (long)p_Var16 != lVar14);
  }
  return;
}

Assistant:

void BlindMerge(std::array<ValueVector *, 2> &arrs, ValueVector &write,
                    typename std::list<RunInfo>::iterator cur_run, size_t arr_index) {
        auto next_run = std::next(cur_run, 1);
        size_t one = cur_run->elem_index,
                two = next_run->elem_index,
                k = cur_run->elem_index;
        ValueVector &curr_arr = *arrs[cur_run->array_index];
        ValueVector &next_arr = *arrs[next_run->array_index];

        while ((one - cur_run->elem_index) < cur_run->run_size &&
               (two - next_run->elem_index) < next_run->run_size) {

            if (curr_arr[one] < next_arr[two]) {
                write[k] = curr_arr[one];
                one++;
            } else {
                write[k] = next_arr[two];
                two++;
            }
            k++;
        }
        // if both runs don't have the same size, copy the remaining elements over
        if ((one - cur_run->elem_index) < cur_run->run_size) {
            for (size_t i = (one - cur_run->elem_index); i < cur_run->run_size; i++) {
                write[k] = curr_arr[i + cur_run->elem_index];
                k++;
            }
        } else {
            for (size_t i = (two - next_run->elem_index); i < next_run->run_size; i++) {
                write[k] = next_arr[i + next_run->elem_index];
                k++;
            }
        }
        cur_run->array_index = arr_index;
    }